

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_7::TwoLevelIterator::key(TwoLevelIterator *this)

{
  uint uVar1;
  Slice SVar2;
  TwoLevelIterator *this_local;
  
  uVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/two_level_iterator.cc"
                  ,0x21,
                  "virtual Slice leveldb::(anonymous namespace)::TwoLevelIterator::key() const");
  }
  SVar2 = IteratorWrapper::key(&this->data_iter_);
  return SVar2;
}

Assistant:

Slice key() const override {
    assert(Valid());
    return data_iter_.key();
  }